

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_4de01d::Handlers::initHandlers(Handlers *this)

{
  pointer *ppsVar1;
  JSONHandler **ppJVar2;
  JSONHandler *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer psVar4;
  pointer psVar5;
  logic_error *this_01;
  undefined1 local_1500 [16];
  undefined1 local_14f0 [23];
  undefined1 local_14d9;
  _Any_data local_14d8;
  code *local_14c8;
  code *local_14c0;
  _Any_data local_14b8;
  code *local_14a8;
  code *local_14a0;
  _Any_data local_1498;
  code *local_1488;
  code *local_1480;
  _Any_data local_1478;
  code *local_1468;
  code *local_1460;
  _Any_data local_1458;
  code *local_1448;
  code *local_1440;
  _Any_data local_1438;
  code *local_1428;
  code *local_1420;
  _Any_data local_1418;
  code *local_1408;
  code *local_1400;
  _Any_data local_13f8;
  code *local_13e8;
  code *local_13e0;
  _Any_data local_13d8;
  code *local_13c8;
  code *local_13c0;
  _Any_data local_13b8;
  code *local_13a8;
  code *local_13a0;
  _Any_data local_1398;
  code *local_1388;
  code *local_1380;
  _Any_data local_1378;
  code *local_1368;
  code *local_1360;
  _Any_data local_1358;
  code *local_1348;
  code *local_1340;
  _Any_data local_1338;
  code *local_1328;
  code *local_1320;
  _Any_data local_1318;
  code *local_1308;
  code *local_1300;
  _Any_data local_12f8;
  code *local_12e8;
  code *local_12e0;
  _Any_data local_12d8;
  code *local_12c8;
  code *local_12c0;
  _Any_data local_12b8;
  code *local_12a8;
  code *local_12a0;
  _Any_data local_1298;
  code *local_1288;
  code *local_1280;
  _Any_data local_1278;
  code *local_1268;
  code *local_1260;
  _Any_data local_1258;
  code *local_1248;
  code *local_1240;
  _Any_data local_1238;
  code *local_1228;
  code *local_1220;
  _Any_data local_1218;
  code *local_1208;
  code *local_1200;
  _Any_data local_11f8;
  code *local_11e8;
  code *local_11e0;
  _Any_data local_11d8;
  code *local_11c8;
  code *local_11c0;
  _Any_data local_11b8;
  code *local_11a8;
  code *local_11a0;
  _Any_data local_1198;
  code *local_1188;
  code *local_1180;
  _Any_data local_1178;
  code *local_1168;
  code *local_1160;
  _Any_data local_1158;
  code *local_1148;
  code *local_1140;
  _Any_data local_1138;
  code *local_1128;
  code *local_1120;
  _Any_data local_1118;
  code *local_1108;
  code *local_1100;
  _Any_data local_10f8;
  code *local_10e8;
  code *local_10e0;
  _Any_data local_10d8;
  code *local_10c8;
  code *local_10c0;
  _Any_data local_10b8;
  code *local_10a8;
  code *local_10a0;
  _Any_data local_1098;
  code *local_1088;
  code *local_1080;
  _Any_data local_1078;
  code *local_1068;
  code *local_1060;
  _Any_data local_1058;
  code *local_1048;
  code *local_1040;
  _Any_data local_1038;
  code *local_1028;
  code *local_1020;
  _Any_data local_1018;
  code *local_1008;
  code *local_1000;
  _Any_data local_ff0;
  code *local_fe0;
  code *local_fd8;
  _Any_data local_fd0;
  code *local_fc0;
  code *local_fb8;
  _Any_data local_fb0;
  code *local_fa0;
  code *local_f98;
  _Any_data local_f90;
  code *local_f80;
  code *local_f78;
  _Any_data local_f70;
  code *local_f60;
  code *local_f58;
  _Any_data local_f50;
  code *local_f40;
  code *local_f38;
  _Any_data local_f30;
  code *local_f20;
  code *local_f18;
  _Any_data local_f10;
  code *local_f00;
  code *local_ef8;
  _Any_data local_ef0;
  code *local_ee0;
  code *local_ed8;
  _Any_data local_ed0;
  code *local_ec0;
  code *local_eb8;
  _Any_data local_eb0;
  code *local_ea0;
  code *local_e98;
  _Any_data local_e90;
  code *local_e80;
  code *local_e78;
  _Any_data local_e70;
  code *local_e60;
  code *local_e58;
  _Any_data local_e50;
  code *local_e40;
  code *local_e38;
  _Any_data local_e30;
  code *local_e20;
  code *local_e18;
  _Any_data local_e10;
  code *local_e00;
  code *local_df8;
  _Any_data local_df0;
  code *local_de0;
  code *local_dd8;
  _Any_data local_dd0;
  code *local_dc0;
  code *local_db8;
  _Any_data local_db0;
  code *local_da0;
  code *local_d98;
  _Any_data local_d90;
  code *local_d80;
  code *local_d78;
  _Any_data local_d70;
  code *local_d60;
  code *local_d58;
  _Any_data local_d50;
  code *local_d40;
  code *local_d38;
  _Any_data local_d30;
  code *local_d20;
  code *local_d18;
  _Any_data local_d10;
  code *local_d00;
  code *local_cf8;
  _Any_data local_cf0;
  code *local_ce0;
  code *local_cd8;
  _Any_data local_cd0;
  code *local_cc0;
  code *local_cb8;
  _Any_data local_cb0;
  code *local_ca0;
  code *local_c98;
  _Any_data local_c90;
  code *local_c80;
  code *local_c78;
  _Any_data local_c70;
  code *local_c60;
  code *local_c58;
  _Any_data local_c50;
  code *local_c40;
  code *local_c38;
  _Any_data local_c30;
  code *local_c20;
  code *local_c18;
  _Any_data local_c10;
  code *local_c00;
  code *local_bf8;
  _Any_data local_bf0;
  code *local_be0;
  code *local_bd8;
  _Any_data local_bd0;
  code *local_bc0;
  code *local_bb8;
  _Any_data local_bb0;
  code *local_ba0;
  code *local_b98;
  _Any_data local_b90;
  code *local_b80;
  code *local_b78;
  _Any_data local_b70;
  code *local_b60;
  code *local_b58;
  _Any_data local_b50;
  code *local_b40;
  code *local_b38;
  _Any_data local_b30;
  code *local_b20;
  code *local_b18;
  _Any_data local_b10;
  code *local_b00;
  code *local_af8;
  _Any_data local_af0;
  code *local_ae0;
  code *local_ad8;
  _Any_data local_ad0;
  code *local_ac0;
  code *local_ab8;
  _Any_data local_ab0;
  code *local_aa0;
  code *local_a98;
  _Any_data local_a90;
  code *local_a80;
  code *local_a78;
  _Any_data local_a70;
  code *local_a60;
  code *local_a58;
  _Any_data local_a50;
  code *local_a40;
  code *local_a38;
  _Any_data local_a30;
  code *local_a20;
  code *local_a18;
  _Any_data local_a10;
  code *local_a00;
  code *local_9f8;
  _Any_data local_9f0;
  code *local_9e0;
  code *local_9d8;
  _Any_data local_9d0;
  code *local_9c0;
  code *local_9b8;
  _Any_data local_9b0;
  code *local_9a0;
  code *local_998;
  _Any_data local_990;
  code *local_980;
  code *local_978;
  _Any_data local_970;
  code *local_960;
  code *local_958;
  _Any_data local_950;
  code *local_940;
  code *local_938;
  _Any_data local_930;
  code *local_920;
  code *local_918;
  _Any_data local_910;
  code *local_900;
  code *local_8f8;
  _Any_data local_8f0;
  code *local_8e0;
  code *local_8d8;
  _Any_data local_8d0;
  code *local_8c0;
  code *local_8b8;
  _Any_data local_8b0;
  code *local_8a0;
  code *local_898;
  _Any_data local_890;
  code *local_880;
  code *local_878;
  _Any_data local_870;
  code *local_860;
  code *local_858;
  _Any_data local_850;
  code *local_840;
  code *local_838;
  _Any_data local_830;
  code *local_820;
  code *local_818;
  _Any_data local_810;
  code *local_800;
  code *local_7f8;
  _Any_data local_7f0;
  code *local_7e0;
  code *local_7d8;
  _Any_data local_7d0;
  code *local_7c0;
  code *local_7b8;
  _Any_data local_7b0;
  code *local_7a0;
  code *local_798;
  _Any_data local_790;
  code *local_780;
  code *local_778;
  _Any_data local_770;
  code *local_760;
  code *local_758;
  _Any_data local_750;
  code *local_740;
  code *local_738;
  _Any_data local_730;
  code *local_720;
  code *local_718;
  _Any_data local_710;
  code *local_700;
  code *local_6f8;
  _Any_data local_6f0;
  code *local_6e0;
  code *local_6d8;
  _Any_data local_6d0;
  code *local_6c0;
  code *local_6b8;
  _Any_data local_6b0;
  code *local_6a0;
  code *local_698;
  _Any_data local_690;
  code *local_680;
  code *local_678;
  _Any_data local_670;
  code *local_660;
  code *local_658;
  _Any_data local_650;
  code *local_640;
  code *local_638;
  _Any_data local_630;
  code *local_620;
  code *local_618;
  _Any_data local_610;
  code *local_600;
  code *local_5f8;
  _Any_data local_5f0;
  code *local_5e0;
  code *local_5d8;
  _Any_data local_5d0;
  code *local_5c0;
  code *local_5b8;
  _Any_data local_5b0;
  code *local_5a0;
  code *local_598;
  _Any_data local_590;
  code *local_580;
  code *local_578;
  _Any_data local_570;
  code *local_560;
  code *local_558;
  _Any_data local_550;
  code *local_540;
  code *local_538;
  _Any_data local_530;
  code *local_520;
  code *local_518;
  _Any_data local_510;
  code *local_500;
  code *local_4f8;
  _Any_data local_4f0;
  code *local_4e0;
  code *local_4d8;
  _Any_data local_4d0;
  code *local_4c0;
  code *local_4b8;
  _Any_data local_4b0;
  code *local_4a0;
  code *local_498;
  _Any_data local_490;
  code *local_480;
  code *local_478;
  _Any_data local_470;
  code *local_460;
  code *local_458;
  _Any_data local_450;
  code *local_440;
  code *local_438;
  _Any_data local_430;
  code *local_420;
  code *local_418;
  _Any_data local_410;
  code *local_400;
  code *local_3f8;
  _Any_data local_3f0;
  code *local_3e0;
  code *local_3d8;
  _Any_data local_3d0;
  code *local_3c0;
  code *local_3b8;
  _Any_data local_3b0;
  code *local_3a0;
  code *local_398;
  _Any_data local_390;
  code *local_380;
  code *local_378;
  _Any_data local_370;
  code *local_360;
  code *local_358;
  _Any_data local_350;
  code *local_340;
  code *local_338;
  _Any_data local_330;
  code *local_320;
  code *local_318;
  _Any_data local_310;
  code *local_300;
  code *local_2f8;
  _Any_data local_2f0;
  code *local_2e0;
  code *local_2d8;
  _Any_data local_2d0;
  code *local_2c0;
  code *local_2b8;
  _Any_data local_2b0;
  code *local_2a0;
  code *local_298;
  _Any_data local_290;
  code *local_280;
  code *local_278;
  _Any_data local_270;
  code *local_260;
  code *local_258;
  _Any_data local_250;
  code *local_240;
  code *local_238;
  _Any_data local_230;
  code *local_220;
  code *local_218;
  _Any_data local_210;
  code *local_200;
  code *local_1f8;
  _Any_data local_1f0;
  code *local_1e0;
  code *local_1d8;
  _Any_data local_1d0;
  code *local_1c0;
  code *local_1b8;
  _Any_data local_1b0;
  code *local_1a0;
  code *local_198;
  _Any_data local_190;
  code *local_180;
  code *local_178;
  _Any_data local_170;
  code *local_160;
  code *local_158;
  _Any_data local_150;
  code *local_140;
  code *local_138;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_1500._0_8_ = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1500 + 8),
             (JSONHandler **)local_1500,(allocator<JSONHandler> *)&local_14d9);
  std::vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>>::
  emplace_back<std::shared_ptr<JSONHandler>>
            ((vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>> *)
             this,(shared_ptr<JSONHandler> *)local_1500);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1500._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1500._8_8_);
  }
  this_00 = (this->json_handlers).
            super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this->jh = this_00;
  local_1018._M_unused._M_object = (void *)0x0;
  local_1018._8_8_ = 0;
  local_1000 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:106:9)>
               ::_M_invoke;
  local_1008 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:106:9)>
               ::_M_manager;
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:107:9)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:107:9)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  JSONHandler::addDictHandlers(this_00,(json_handler_t *)&local_1018,(void_handler_t *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_1008 != (code *)0x0) {
    (*local_1008)(&local_1018,&local_1018,__destroy_functor);
  }
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"inputFile","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1500._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f0._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:246:18)>
       ::_M_invoke;
  local_14f0._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:246:18)>
       ::_M_manager;
  local_1500._0_8_ = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)local_1500);
  if ((__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>)
      local_14f0._0_8_ !=
      (tuple<JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>)0x0) {
    (*(code *)local_14f0._0_8_)(local_1500,local_1500,3);
  }
  ppsVar1 = &(this->json_handlers).
             super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppJVar2 = &this->jh;
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"password","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1500._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f0._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:252:18)>
       ::_M_invoke;
  local_14f0._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:252:18)>
       ::_M_manager;
  local_1500._0_8_ = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)local_1500);
  if ((__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>)
      local_14f0._0_8_ !=
      (tuple<JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>)0x0) {
    (*(code *)local_14f0._0_8_)(local_1500,local_1500,3);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"passwordFile","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:30:14)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:30:14)>
             ::_M_manager;
  local_70._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"empty","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1500._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f0._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:258:13)>
       ::_M_invoke;
  local_14f0._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:258:13)>
       ::_M_manager;
  local_1500._0_8_ = this;
  addBare(this,(bare_handler_t *)local_1500);
  if ((__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>)
      local_14f0._0_8_ !=
      (tuple<JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>)0x0) {
    (*(code *)local_14f0._0_8_)(local_1500,local_1500,3);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"jsonInput","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:36:9)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:36:9)>
             ::_M_manager;
  local_90._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"outputFile","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1500._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f0._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:264:18)>
       ::_M_invoke;
  local_14f0._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:264:18)>
       ::_M_manager;
  local_1500._0_8_ = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)local_1500);
  if ((__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>)
      local_14f0._0_8_ !=
      (tuple<JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>)0x0) {
    (*(code *)local_14f0._0_8_)(local_1500,local_1500,3);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"replaceInput","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1500._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f0._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:270:13)>
       ::_M_invoke;
  local_14f0._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:270:13)>
       ::_M_manager;
  local_1500._0_8_ = this;
  addBare(this,(bare_handler_t *)local_1500);
  if ((__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>)
      local_14f0._0_8_ !=
      (tuple<JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>)0x0) {
    (*(code *)local_14f0._0_8_)(local_1500,local_1500,3);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"qdf","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:45:9)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:45:9)>
             ::_M_manager;
  local_b0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_b0);
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"preserveUnreferenced","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:48:9)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:48:9)>
             ::_M_manager;
  local_d0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_d0);
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"newlineBeforeEndstream","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_f0._8_8_ = 0;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:51:9)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:51:9)>
             ::_M_manager;
  local_f0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_f0);
  if (local_e0 != (code *)0x0) {
    (*local_e0)(&local_f0,&local_f0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"normalizeContent","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_110._8_8_ = 0;
  local_f8 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:54:30)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:54:30)>
              ::_M_manager;
  local_110._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_110);
  if (local_100 != (code *)0x0) {
    (*local_100)(&local_110,&local_110,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"streamData","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_130._8_8_ = 0;
  local_118 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:57:39)>
              ::_M_invoke;
  local_120 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:57:39)>
              ::_M_manager;
  local_130._M_unused._M_object = this;
  addChoices(this,initHandlers::stream_data_choices,true,(param_handler_t *)&local_130);
  if (local_120 != (code *)0x0) {
    (*local_120)(&local_130,&local_130,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"compressStreams","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_150._8_8_ = 0;
  local_138 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:60:30)>
              ::_M_invoke;
  local_140 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:60:30)>
              ::_M_manager;
  local_150._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_150);
  if (local_140 != (code *)0x0) {
    (*local_140)(&local_150,&local_150,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"recompressFlate","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_170._8_8_ = 0;
  local_158 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:63:9)>
              ::_M_invoke;
  local_160 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:63:9)>
              ::_M_manager;
  local_170._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_170);
  if (local_160 != (code *)0x0) {
    (*local_160)(&local_170,&local_170,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"decodeLevel","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_190._8_8_ = 0;
  local_178 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:66:40)>
              ::_M_invoke;
  local_180 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:66:40)>
              ::_M_manager;
  local_190._M_unused._M_object = this;
  addChoices(this,initHandlers::decode_level_choices,true,(param_handler_t *)&local_190);
  if (local_180 != (code *)0x0) {
    (*local_180)(&local_190,&local_190,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"decrypt","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1b0._8_8_ = 0;
  local_198 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:69:9)>
              ::_M_invoke;
  local_1a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:69:9)>
              ::_M_manager;
  local_1b0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_1b0);
  if (local_1a0 != (code *)0x0) {
    (*local_1a0)(&local_1b0,&local_1b0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"deterministicId","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1d0._8_8_ = 0;
  local_1b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:72:9)>
              ::_M_invoke;
  local_1c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:72:9)>
              ::_M_manager;
  local_1d0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_1d0);
  if (local_1c0 != (code *)0x0) {
    (*local_1c0)(&local_1d0,&local_1d0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"staticAesIv","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1f0._8_8_ = 0;
  local_1d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:75:9)>
              ::_M_invoke;
  local_1e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:75:9)>
              ::_M_manager;
  local_1f0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_1f0);
  if (local_1e0 != (code *)0x0) {
    (*local_1e0)(&local_1f0,&local_1f0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"staticId","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_210._8_8_ = 0;
  local_1f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:78:9)>
              ::_M_invoke;
  local_200 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:78:9)>
              ::_M_manager;
  local_210._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_210);
  if (local_200 != (code *)0x0) {
    (*local_200)(&local_210,&local_210,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"noOriginalObjectIds","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_230._8_8_ = 0;
  local_218 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:81:9)>
              ::_M_invoke;
  local_220 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:81:9)>
              ::_M_manager;
  local_230._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_230);
  if (local_220 != (code *)0x0) {
    (*local_220)(&local_230,&local_230,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"copyEncryption","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_250._8_8_ = 0;
  local_238 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:84:14)>
              ::_M_invoke;
  local_240 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:84:14)>
              ::_M_manager;
  local_250._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_250);
  if (local_240 != (code *)0x0) {
    (*local_240)(&local_250,&local_250,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"encryptionFilePassword","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_270._8_8_ = 0;
  local_258 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:87:14)>
              ::_M_invoke;
  local_260 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:87:14)>
              ::_M_manager;
  local_270._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_270);
  if (local_260 != (code *)0x0) {
    (*local_260)(&local_270,&local_270,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"linearize","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_290._8_8_ = 0;
  local_278 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:90:9)>
              ::_M_invoke;
  local_280 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:90:9)>
              ::_M_manager;
  local_290._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_290);
  if (local_280 != (code *)0x0) {
    (*local_280)(&local_290,&local_290,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"linearizePass1","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_2b0._8_8_ = 0;
  local_298 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:93:14)>
              ::_M_invoke;
  local_2a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:93:14)>
              ::_M_manager;
  local_2b0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_2b0);
  if (local_2a0 != (code *)0x0) {
    (*local_2a0)(&local_2b0,&local_2b0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"objectStreams","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_2d0._8_8_ = 0;
  local_2b8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:96:42)>
              ::_M_invoke;
  local_2c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:96:42)>
              ::_M_manager;
  local_2d0._M_unused._M_object = this;
  addChoices(this,initHandlers::object_streams_choices,true,(param_handler_t *)&local_2d0);
  if (local_2c0 != (code *)0x0) {
    (*local_2c0)(&local_2d0,&local_2d0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"minVersion","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_2f0._8_8_ = 0;
  local_2d8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:99:14)>
              ::_M_invoke;
  local_2e0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:99:14)>
              ::_M_manager;
  local_2f0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_2f0);
  if (local_2e0 != (code *)0x0) {
    (*local_2e0)(&local_2f0,&local_2f0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"forceVersion","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_310._8_8_ = 0;
  local_2f8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:102:14)>
              ::_M_invoke;
  local_300 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:102:14)>
              ::_M_manager;
  local_310._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_310);
  if (local_300 != (code *)0x0) {
    (*local_300)(&local_310,&local_310,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"progress","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_330._8_8_ = 0;
  local_318 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:105:9)>
              ::_M_invoke;
  local_320 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:105:9)>
              ::_M_manager;
  local_330._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_330);
  if (local_320 != (code *)0x0) {
    (*local_320)(&local_330,&local_330,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"splitPages","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_350._8_8_ = 0;
  local_338 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:108:14)>
              ::_M_invoke;
  local_340 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:108:14)>
              ::_M_manager;
  local_350._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_350);
  if (local_340 != (code *)0x0) {
    (*local_340)(&local_350,&local_350,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"jsonOutput","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_370._8_8_ = 0;
  local_358 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:111:40)>
              ::_M_invoke;
  local_360 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:111:40)>
              ::_M_manager;
  local_370._M_unused._M_object = this;
  addChoices(this,initHandlers::json_output_choices,false,(param_handler_t *)&local_370);
  if (local_360 != (code *)0x0) {
    (*local_360)(&local_370,&local_370,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"removeRestrictions","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_390._8_8_ = 0;
  local_378 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:114:9)>
              ::_M_invoke;
  local_380 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:114:9)>
              ::_M_manager;
  local_390._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_390);
  if (local_380 != (code *)0x0) {
    (*local_380)(&local_390,&local_390,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"encrypt","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1298._8_8_ = 0;
  local_1298._M_unused._M_object = operator_new(0x18);
  *(code **)local_1298._M_unused._0_8_ = beginEncrypt;
  *(undefined8 *)((long)local_1298._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1298._M_unused._0_8_ + 0x10) = this;
  local_1280 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_1288 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1038._8_8_ = 0;
  local_1038._M_unused._M_object = operator_new(0x18);
  *(code **)local_1038._M_unused._0_8_ = endEncrypt;
  *(undefined8 *)((long)local_1038._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1038._M_unused._0_8_ + 0x10) = this;
  local_1020 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_1028 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict((Handlers *)this->jh,(json_handler_t *)&local_1298,(bare_handler_t *)&local_1038);
  if (local_1028 != (code *)0x0) {
    (*local_1028)(&local_1038,&local_1038,__destroy_functor);
  }
  if (local_1288 != (code *)0x0) {
    (*local_1288)(&local_1298,&local_1298,__destroy_functor);
  }
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"userPassword","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  ignoreItem((Handlers *)*ppJVar2);
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"ownerPassword","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  ignoreItem((Handlers *)*ppJVar2);
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"Bits","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"40bit","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_12b8._8_8_ = 0;
  local_12b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_12b8._M_unused._0_8_ = beginEncrypt40bit;
  *(undefined8 *)((long)local_12b8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_12b8._M_unused._0_8_ + 0x10) = this;
  local_12a0 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_12a8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1058._8_8_ = 0;
  local_1058._M_unused._M_object = operator_new(0x18);
  *(code **)local_1058._M_unused._0_8_ = endEncrypt40bit;
  *(undefined8 *)((long)local_1058._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1058._M_unused._0_8_ + 0x10) = this;
  local_1040 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_1048 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict((Handlers *)this->jh,(json_handler_t *)&local_12b8,(bare_handler_t *)&local_1058);
  if (local_1048 != (code *)0x0) {
    (*local_1048)(&local_1058,&local_1058,__destroy_functor);
  }
  if (local_12a8 != (code *)0x0) {
    (*local_12a8)(&local_12b8,&local_12b8,__destroy_functor);
  }
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"annotate","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_3b0._8_8_ = 0;
  local_398 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:129:30)>
              ::_M_invoke;
  local_3a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:129:30)>
              ::_M_manager;
  local_3b0._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_3b0);
  if (local_3a0 != (code *)0x0) {
    (*local_3a0)(&local_3b0,&local_3b0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"extract","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_3d0._8_8_ = 0;
  local_3b8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:132:30)>
              ::_M_invoke;
  local_3c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:132:30)>
              ::_M_manager;
  local_3d0._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_3d0);
  if (local_3c0 != (code *)0x0) {
    (*local_3c0)(&local_3d0,&local_3d0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"modify","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_3f0._8_8_ = 0;
  local_3d8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:135:37)>
              ::_M_invoke;
  local_3e0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:135:37)>
              ::_M_manager;
  local_3f0._M_unused._M_object = this;
  addChoices(this,initHandlers::modify128_choices,true,(param_handler_t *)&local_3f0);
  if (local_3e0 != (code *)0x0) {
    (*local_3e0)(&local_3f0,&local_3f0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"print","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_410._8_8_ = 0;
  local_3f8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:138:36)>
              ::_M_invoke;
  local_400 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:138:36)>
              ::_M_manager;
  local_410._M_unused._M_object = this;
  addChoices(this,initHandlers::print128_choices,true,(param_handler_t *)&local_410);
  if (local_400 != (code *)0x0) {
    (*local_400)(&local_410,&local_410,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  psVar4 = psVar5 + -1;
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar4;
  p_Var3 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar4 = *ppsVar1;
  }
  *ppJVar2 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"128bit","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_12d8._8_8_ = 0;
  local_12d8._M_unused._M_object = operator_new(0x18);
  *(code **)local_12d8._M_unused._0_8_ = beginEncrypt128bit;
  *(undefined8 *)((long)local_12d8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_12d8._M_unused._0_8_ + 0x10) = this;
  local_12c0 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_12c8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1078._8_8_ = 0;
  local_1078._M_unused._M_object = operator_new(0x18);
  *(code **)local_1078._M_unused._0_8_ = endEncrypt128bit;
  *(undefined8 *)((long)local_1078._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1078._M_unused._0_8_ + 0x10) = this;
  local_1060 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_1068 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict((Handlers *)this->jh,(json_handler_t *)&local_12d8,(bare_handler_t *)&local_1078);
  if (local_1068 != (code *)0x0) {
    (*local_1068)(&local_1078,&local_1078,__destroy_functor);
  }
  if (local_12c8 != (code *)0x0) {
    (*local_12c8)(&local_12d8,&local_12d8,__destroy_functor);
  }
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"accessibility","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_430._8_8_ = 0;
  local_418 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:144:30)>
              ::_M_invoke;
  local_420 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:144:30)>
              ::_M_manager;
  local_430._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_430);
  if (local_420 != (code *)0x0) {
    (*local_420)(&local_430,&local_430,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"annotate","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_450._8_8_ = 0;
  local_438 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:147:30)>
              ::_M_invoke;
  local_440 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:147:30)>
              ::_M_manager;
  local_450._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_450);
  if (local_440 != (code *)0x0) {
    (*local_440)(&local_450,&local_450,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"assemble","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_470._8_8_ = 0;
  local_458 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:150:30)>
              ::_M_invoke;
  local_460 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:150:30)>
              ::_M_manager;
  local_470._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_470);
  if (local_460 != (code *)0x0) {
    (*local_460)(&local_470,&local_470,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"cleartextMetadata","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_490._8_8_ = 0;
  local_478 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:153:9)>
              ::_M_invoke;
  local_480 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:153:9)>
              ::_M_manager;
  local_490._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_490);
  if (local_480 != (code *)0x0) {
    (*local_480)(&local_490,&local_490,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"extract","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_4b0._8_8_ = 0;
  local_498 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:156:30)>
              ::_M_invoke;
  local_4a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:156:30)>
              ::_M_manager;
  local_4b0._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_4b0);
  if (local_4a0 != (code *)0x0) {
    (*local_4a0)(&local_4b0,&local_4b0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"form","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_4d0._8_8_ = 0;
  local_4b8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:159:30)>
              ::_M_invoke;
  local_4c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:159:30)>
              ::_M_manager;
  local_4d0._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_4d0);
  if (local_4c0 != (code *)0x0) {
    (*local_4c0)(&local_4d0,&local_4d0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"modifyOther","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_4f0._8_8_ = 0;
  local_4d8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:162:30)>
              ::_M_invoke;
  local_4e0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:162:30)>
              ::_M_manager;
  local_4f0._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_4f0);
  if (local_4e0 != (code *)0x0) {
    (*local_4e0)(&local_4f0,&local_4f0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"modify","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_510._8_8_ = 0;
  local_4f8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:165:37)>
              ::_M_invoke;
  local_500 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:165:37)>
              ::_M_manager;
  local_510._M_unused._M_object = this;
  addChoices(this,initHandlers::modify128_choices,true,(param_handler_t *)&local_510);
  if (local_500 != (code *)0x0) {
    (*local_500)(&local_510,&local_510,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"print","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_530._8_8_ = 0;
  local_518 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:168:36)>
              ::_M_invoke;
  local_520 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:168:36)>
              ::_M_manager;
  local_530._M_unused._M_object = this;
  addChoices(this,initHandlers::print128_choices,true,(param_handler_t *)&local_530);
  if (local_520 != (code *)0x0) {
    (*local_520)(&local_530,&local_530,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"forceV4","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_550._8_8_ = 0;
  local_538 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:171:9)>
              ::_M_invoke;
  local_540 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:171:9)>
              ::_M_manager;
  local_550._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_550);
  if (local_540 != (code *)0x0) {
    (*local_540)(&local_550,&local_550,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"useAes","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_570._8_8_ = 0;
  local_558 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:174:30)>
              ::_M_invoke;
  local_560 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:174:30)>
              ::_M_manager;
  local_570._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_570);
  if (local_560 != (code *)0x0) {
    (*local_560)(&local_570,&local_570,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  psVar4 = psVar5 + -1;
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar4;
  p_Var3 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar4 = *ppsVar1;
  }
  *ppJVar2 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"256bit","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_12f8._8_8_ = 0;
  local_12f8._M_unused._M_object = operator_new(0x18);
  *(code **)local_12f8._M_unused._0_8_ = beginEncrypt256bit;
  *(undefined8 *)((long)local_12f8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_12f8._M_unused._0_8_ + 0x10) = this;
  local_12e0 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_12e8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1098._8_8_ = 0;
  local_1098._M_unused._M_object = operator_new(0x18);
  *(code **)local_1098._M_unused._0_8_ = endEncrypt256bit;
  *(undefined8 *)((long)local_1098._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1098._M_unused._0_8_ + 0x10) = this;
  local_1080 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_1088 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict((Handlers *)this->jh,(json_handler_t *)&local_12f8,(bare_handler_t *)&local_1098);
  if (local_1088 != (code *)0x0) {
    (*local_1088)(&local_1098,&local_1098,__destroy_functor);
  }
  if (local_12e8 != (code *)0x0) {
    (*local_12e8)(&local_12f8,&local_12f8,__destroy_functor);
  }
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"accessibility","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_590._8_8_ = 0;
  local_578 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:180:30)>
              ::_M_invoke;
  local_580 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:180:30)>
              ::_M_manager;
  local_590._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_590);
  if (local_580 != (code *)0x0) {
    (*local_580)(&local_590,&local_590,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"annotate","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_5b0._8_8_ = 0;
  local_598 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:183:30)>
              ::_M_invoke;
  local_5a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:183:30)>
              ::_M_manager;
  local_5b0._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_5b0);
  if (local_5a0 != (code *)0x0) {
    (*local_5a0)(&local_5b0,&local_5b0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"assemble","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_5d0._8_8_ = 0;
  local_5b8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:186:30)>
              ::_M_invoke;
  local_5c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:186:30)>
              ::_M_manager;
  local_5d0._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_5d0);
  if (local_5c0 != (code *)0x0) {
    (*local_5c0)(&local_5d0,&local_5d0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"cleartextMetadata","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_5f0._8_8_ = 0;
  local_5d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:189:9)>
              ::_M_invoke;
  local_5e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:189:9)>
              ::_M_manager;
  local_5f0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_5f0);
  if (local_5e0 != (code *)0x0) {
    (*local_5e0)(&local_5f0,&local_5f0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"extract","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_610._8_8_ = 0;
  local_5f8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:192:30)>
              ::_M_invoke;
  local_600 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:192:30)>
              ::_M_manager;
  local_610._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_610);
  if (local_600 != (code *)0x0) {
    (*local_600)(&local_610,&local_610,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"form","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_630._8_8_ = 0;
  local_618 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:195:30)>
              ::_M_invoke;
  local_620 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:195:30)>
              ::_M_manager;
  local_630._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_630);
  if (local_620 != (code *)0x0) {
    (*local_620)(&local_630,&local_630,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"modifyOther","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_650._8_8_ = 0;
  local_638 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:198:30)>
              ::_M_invoke;
  local_640 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:198:30)>
              ::_M_manager;
  local_650._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_650);
  if (local_640 != (code *)0x0) {
    (*local_640)(&local_650,&local_650,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"modify","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_670._8_8_ = 0;
  local_658 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:201:37)>
              ::_M_invoke;
  local_660 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:201:37)>
              ::_M_manager;
  local_670._M_unused._M_object = this;
  addChoices(this,initHandlers::modify128_choices,true,(param_handler_t *)&local_670);
  if (local_660 != (code *)0x0) {
    (*local_660)(&local_670,&local_670,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"print","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_690._8_8_ = 0;
  local_678 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:204:36)>
              ::_M_invoke;
  local_680 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:204:36)>
              ::_M_manager;
  local_690._M_unused._M_object = this;
  addChoices(this,initHandlers::print128_choices,true,(param_handler_t *)&local_690);
  if (local_680 != (code *)0x0) {
    (*local_680)(&local_690,&local_690,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"allowInsecure","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_6b0._8_8_ = 0;
  local_698 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:207:9)>
              ::_M_invoke;
  local_6a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:207:9)>
              ::_M_manager;
  local_6b0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_6b0);
  if (local_6a0 != (code *)0x0) {
    (*local_6a0)(&local_6b0,&local_6b0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"forceR5","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_6d0._8_8_ = 0;
  local_6b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:210:9)>
              ::_M_invoke;
  local_6c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:210:9)>
              ::_M_manager;
  local_6d0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_6d0);
  if (local_6c0 != (code *)0x0) {
    (*local_6c0)(&local_6d0,&local_6d0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  psVar4 = psVar5 + -1;
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar4;
  p_Var3 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar4 = *ppsVar1;
  }
  psVar5 = psVar4 + -1;
  *ppJVar2 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"check","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_6f0._8_8_ = 0;
  local_6d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:215:9)>
              ::_M_invoke;
  local_6e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:215:9)>
              ::_M_manager;
  local_6f0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_6f0);
  if (local_6e0 != (code *)0x0) {
    (*local_6e0)(&local_6f0,&local_6f0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"checkLinearization","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_710._8_8_ = 0;
  local_6f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:218:9)>
              ::_M_invoke;
  local_700 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:218:9)>
              ::_M_manager;
  local_710._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_710);
  if (local_700 != (code *)0x0) {
    (*local_700)(&local_710,&local_710,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"filteredStreamData","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_730._8_8_ = 0;
  local_718 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:221:9)>
              ::_M_invoke;
  local_720 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:221:9)>
              ::_M_manager;
  local_730._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_730);
  if (local_720 != (code *)0x0) {
    (*local_720)(&local_730,&local_730,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"rawStreamData","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_750._8_8_ = 0;
  local_738 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:224:9)>
              ::_M_invoke;
  local_740 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:224:9)>
              ::_M_manager;
  local_750._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_750);
  if (local_740 != (code *)0x0) {
    (*local_740)(&local_750,&local_750,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"showEncryption","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_770._8_8_ = 0;
  local_758 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:227:9)>
              ::_M_invoke;
  local_760 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:227:9)>
              ::_M_manager;
  local_770._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_770);
  if (local_760 != (code *)0x0) {
    (*local_760)(&local_770,&local_770,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"showEncryptionKey","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_790._8_8_ = 0;
  local_778 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:230:9)>
              ::_M_invoke;
  local_780 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:230:9)>
              ::_M_manager;
  local_790._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_790);
  if (local_780 != (code *)0x0) {
    (*local_780)(&local_790,&local_790,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"showLinearization","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_7b0._8_8_ = 0;
  local_798 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:233:9)>
              ::_M_invoke;
  local_7a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:233:9)>
              ::_M_manager;
  local_7b0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_7b0);
  if (local_7a0 != (code *)0x0) {
    (*local_7a0)(&local_7b0,&local_7b0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"showNpages","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_7d0._8_8_ = 0;
  local_7b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:236:9)>
              ::_M_invoke;
  local_7c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:236:9)>
              ::_M_manager;
  local_7d0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_7d0);
  if (local_7c0 != (code *)0x0) {
    (*local_7c0)(&local_7d0,&local_7d0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"showObject","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_7f0._8_8_ = 0;
  local_7d8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:239:14)>
              ::_M_invoke;
  local_7e0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:239:14)>
              ::_M_manager;
  local_7f0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_7f0);
  if (local_7e0 != (code *)0x0) {
    (*local_7e0)(&local_7f0,&local_7f0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"showPages","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_810._8_8_ = 0;
  local_7f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:242:9)>
              ::_M_invoke;
  local_800 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:242:9)>
              ::_M_manager;
  local_810._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_810);
  if (local_800 != (code *)0x0) {
    (*local_800)(&local_810,&local_810,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"showXref","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_830._8_8_ = 0;
  local_818 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:245:9)>
              ::_M_invoke;
  local_820 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:245:9)>
              ::_M_manager;
  local_830._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_830);
  if (local_820 != (code *)0x0) {
    (*local_820)(&local_830,&local_830,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"withImages","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_850._8_8_ = 0;
  local_838 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:248:9)>
              ::_M_invoke;
  local_840 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:248:9)>
              ::_M_manager;
  local_850._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_850);
  if (local_840 != (code *)0x0) {
    (*local_840)(&local_850,&local_850,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"listAttachments","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_870._8_8_ = 0;
  local_858 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:251:9)>
              ::_M_invoke;
  local_860 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:251:9)>
              ::_M_manager;
  local_870._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_870);
  if (local_860 != (code *)0x0) {
    (*local_860)(&local_870,&local_870,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"showAttachment","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_890._8_8_ = 0;
  local_878 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:254:14)>
              ::_M_invoke;
  local_880 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:254:14)>
              ::_M_manager;
  local_890._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_890);
  if (local_880 != (code *)0x0) {
    (*local_880)(&local_890,&local_890,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"json","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_8b0._8_8_ = 0;
  local_898 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:257:41)>
              ::_M_invoke;
  local_8a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:257:41)>
              ::_M_manager;
  local_8b0._M_unused._M_object = this;
  addChoices(this,initHandlers::json_version_choices,false,(param_handler_t *)&local_8b0);
  if (local_8a0 != (code *)0x0) {
    (*local_8a0)(&local_8b0,&local_8b0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"jsonKey","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1318._8_8_ = 0;
  local_1318._M_unused._M_object = operator_new(0x18);
  *(code **)local_1318._M_unused._0_8_ = beginJsonKeyArray;
  *(undefined8 *)((long)local_1318._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1318._M_unused._0_8_ + 0x10) = this;
  local_1300 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_1308 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_10b8._8_8_ = 0;
  local_10b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_10b8._M_unused._0_8_ = endJsonKeyArray;
  *(undefined8 *)((long)local_10b8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_10b8._M_unused._0_8_ + 0x10) = this;
  local_10a0 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_10a8 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1318,(bare_handler_t *)&local_10b8);
  if (local_10a8 != (code *)0x0) {
    (*local_10a8)(&local_10b8,&local_10b8,__destroy_functor);
  }
  if (local_1308 != (code *)0x0) {
    (*local_1308)(&local_1318,&local_1318,__destroy_functor);
  }
  local_8d0._8_8_ = 0;
  local_8b8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:261:36)>
              ::_M_invoke;
  local_8c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:261:36)>
              ::_M_manager;
  local_8d0._M_unused._M_object = this;
  addChoices(this,initHandlers::json_key_choices,true,(param_handler_t *)&local_8d0);
  if (local_8c0 != (code *)0x0) {
    (*local_8c0)(&local_8d0,&local_8d0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  psVar4 = psVar5 + -1;
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar4;
  p_Var3 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar4 = *ppsVar1;
  }
  *ppJVar2 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"jsonObject","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1338._8_8_ = 0;
  local_1338._M_unused._M_object = operator_new(0x18);
  *(code **)local_1338._M_unused._0_8_ = beginJsonObjectArray;
  *(undefined8 *)((long)local_1338._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1338._M_unused._0_8_ + 0x10) = this;
  local_1320 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_1328 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_10d8._8_8_ = 0;
  local_10d8._M_unused._M_object = operator_new(0x18);
  *(code **)local_10d8._M_unused._0_8_ = endJsonObjectArray;
  *(undefined8 *)((long)local_10d8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_10d8._M_unused._0_8_ + 0x10) = this;
  local_10c0 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_10c8 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1338,(bare_handler_t *)&local_10d8);
  if (local_10c8 != (code *)0x0) {
    (*local_10c8)(&local_10d8,&local_10d8,__destroy_functor);
  }
  if (local_1328 != (code *)0x0) {
    (*local_1328)(&local_1338,&local_1338,__destroy_functor);
  }
  local_8f0._8_8_ = 0;
  local_8d8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:266:14)>
              ::_M_invoke;
  local_8e0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:266:14)>
              ::_M_manager;
  local_8f0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_8f0);
  if (local_8e0 != (code *)0x0) {
    (*local_8e0)(&local_8f0,&local_8f0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  psVar4 = psVar5 + -1;
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar4;
  p_Var3 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar4 = *ppsVar1;
  }
  *ppJVar2 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"jsonStreamData","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_910._8_8_ = 0;
  local_8f8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:270:44)>
              ::_M_invoke;
  local_900 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:270:44)>
              ::_M_manager;
  local_910._M_unused._M_object = this;
  addChoices(this,initHandlers::json_stream_data_choices,true,(param_handler_t *)&local_910);
  if (local_900 != (code *)0x0) {
    (*local_900)(&local_910,&local_910,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"jsonStreamPrefix","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_930._8_8_ = 0;
  local_918 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:273:14)>
              ::_M_invoke;
  local_920 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:273:14)>
              ::_M_manager;
  local_930._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_930);
  if (local_920 != (code *)0x0) {
    (*local_920)(&local_930,&local_930,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"updateFromJson","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_950._8_8_ = 0;
  local_938 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:276:14)>
              ::_M_invoke;
  local_940 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:276:14)>
              ::_M_manager;
  local_950._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_950);
  if (local_940 != (code *)0x0) {
    (*local_940)(&local_950,&local_950,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"allowWeakCrypto","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_970._8_8_ = 0;
  local_958 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:279:9)>
              ::_M_invoke;
  local_960 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:279:9)>
              ::_M_manager;
  local_970._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_970);
  if (local_960 != (code *)0x0) {
    (*local_960)(&local_970,&local_970,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"keepFilesOpen","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_990._8_8_ = 0;
  local_978 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:282:30)>
              ::_M_invoke;
  local_980 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:282:30)>
              ::_M_manager;
  local_990._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_990);
  if (local_980 != (code *)0x0) {
    (*local_980)(&local_990,&local_990,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"keepFilesOpenThreshold","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_9b0._8_8_ = 0;
  local_998 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:285:14)>
              ::_M_invoke;
  local_9a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:285:14)>
              ::_M_manager;
  local_9b0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_9b0);
  if (local_9a0 != (code *)0x0) {
    (*local_9a0)(&local_9b0,&local_9b0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"noWarn","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_9d0._8_8_ = 0;
  local_9b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:288:9)>
              ::_M_invoke;
  local_9c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:288:9)>
              ::_M_manager;
  local_9d0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_9d0);
  if (local_9c0 != (code *)0x0) {
    (*local_9c0)(&local_9d0,&local_9d0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"verbose","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_9f0._8_8_ = 0;
  local_9d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:291:9)>
              ::_M_invoke;
  local_9e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:291:9)>
              ::_M_manager;
  local_9f0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_9f0);
  if (local_9e0 != (code *)0x0) {
    (*local_9e0)(&local_9f0,&local_9f0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"testJsonSchema","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_a10._8_8_ = 0;
  local_9f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:294:9)>
              ::_M_invoke;
  local_a00 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:294:9)>
              ::_M_manager;
  local_a10._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_a10);
  if (local_a00 != (code *)0x0) {
    (*local_a00)(&local_a10,&local_a10,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"ignoreXrefStreams","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_a30._8_8_ = 0;
  local_a18 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:297:9)>
              ::_M_invoke;
  local_a20 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:297:9)>
              ::_M_manager;
  local_a30._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_a30);
  if (local_a20 != (code *)0x0) {
    (*local_a20)(&local_a30,&local_a30,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"passwordIsHexKey","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_a50._8_8_ = 0;
  local_a38 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:300:9)>
              ::_M_invoke;
  local_a40 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:300:9)>
              ::_M_manager;
  local_a50._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_a50);
  if (local_a40 != (code *)0x0) {
    (*local_a40)(&local_a50,&local_a50,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"passwordMode","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_a70._8_8_ = 0;
  local_a58 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:303:41)>
              ::_M_invoke;
  local_a60 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:303:41)>
              ::_M_manager;
  local_a70._M_unused._M_object = this;
  addChoices(this,initHandlers::password_mode_choices,true,(param_handler_t *)&local_a70);
  if (local_a60 != (code *)0x0) {
    (*local_a60)(&local_a70,&local_a70,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1500,"suppressPasswordRecovery","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_a90._8_8_ = 0;
  local_a78 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:306:9)>
              ::_M_invoke;
  local_a80 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:306:9)>
              ::_M_manager;
  local_a90._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_a90);
  if (local_a80 != (code *)0x0) {
    (*local_a80)(&local_a90,&local_a90,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"suppressRecovery","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_ab0._8_8_ = 0;
  local_a98 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:309:9)>
              ::_M_invoke;
  local_aa0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:309:9)>
              ::_M_manager;
  local_ab0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_ab0);
  if (local_aa0 != (code *)0x0) {
    (*local_aa0)(&local_ab0,&local_ab0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"coalesceContents","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_ad0._8_8_ = 0;
  local_ab8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:312:9)>
              ::_M_invoke;
  local_ac0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:312:9)>
              ::_M_manager;
  local_ad0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_ad0);
  if (local_ac0 != (code *)0x0) {
    (*local_ac0)(&local_ad0,&local_ad0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"compressionLevel","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_af0._8_8_ = 0;
  local_ad8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:315:14)>
              ::_M_invoke;
  local_ae0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:315:14)>
              ::_M_manager;
  local_af0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_af0);
  if (local_ae0 != (code *)0x0) {
    (*local_ae0)(&local_af0,&local_af0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"jpegQuality","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_b10._8_8_ = 0;
  local_af8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:318:14)>
              ::_M_invoke;
  local_b00 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:318:14)>
              ::_M_manager;
  local_b10._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_b10);
  if (local_b00 != (code *)0x0) {
    (*local_b00)(&local_b10,&local_b10,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"externalizeInlineImages","")
  ;
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_b30._8_8_ = 0;
  local_b18 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:321:9)>
              ::_M_invoke;
  local_b20 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:321:9)>
              ::_M_manager;
  local_b30._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_b30);
  if (local_b20 != (code *)0x0) {
    (*local_b20)(&local_b30,&local_b30,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"iiMinBytes","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_b50._8_8_ = 0;
  local_b38 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:324:14)>
              ::_M_invoke;
  local_b40 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:324:14)>
              ::_M_manager;
  local_b50._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_b50);
  if (local_b40 != (code *)0x0) {
    (*local_b40)(&local_b50,&local_b50,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1500,"removeUnreferencedResources","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_b70._8_8_ = 0;
  local_b58 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:327:40)>
              ::_M_invoke;
  local_b60 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:327:40)>
              ::_M_manager;
  local_b70._M_unused._M_object = this;
  addChoices(this,initHandlers::remove_unref_choices,true,(param_handler_t *)&local_b70);
  if (local_b60 != (code *)0x0) {
    (*local_b60)(&local_b70,&local_b70,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"addAttachment","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1358._8_8_ = 0;
  local_1358._M_unused._M_object = operator_new(0x18);
  *(code **)local_1358._M_unused._0_8_ = beginAddAttachmentArray;
  *(undefined8 *)((long)local_1358._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1358._M_unused._0_8_ + 0x10) = this;
  local_1340 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_1348 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_10f8._8_8_ = 0;
  local_10f8._M_unused._M_object = operator_new(0x18);
  *(code **)local_10f8._M_unused._0_8_ = endAddAttachmentArray;
  *(undefined8 *)((long)local_10f8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_10f8._M_unused._0_8_ + 0x10) = this;
  local_10e0 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_10e8 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1358,(bare_handler_t *)&local_10f8);
  if (local_10e8 != (code *)0x0) {
    (*local_10e8)(&local_10f8,&local_10f8,__destroy_functor);
  }
  if (local_1348 != (code *)0x0) {
    (*local_1348)(&local_1358,&local_1358,__destroy_functor);
  }
  local_1378._8_8_ = 0;
  local_1378._M_unused._M_object = operator_new(0x18);
  *(code **)local_1378._M_unused._0_8_ = beginAddAttachment;
  *(undefined8 *)((long)local_1378._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1378._M_unused._0_8_ + 0x10) = this;
  local_1360 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_1368 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1118._8_8_ = 0;
  local_1118._M_unused._M_object = operator_new(0x18);
  *(code **)local_1118._M_unused._0_8_ = endAddAttachment;
  *(undefined8 *)((long)local_1118._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1118._M_unused._0_8_ + 0x10) = this;
  local_1100 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_1108 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict((Handlers *)this->jh,(json_handler_t *)&local_1378,(bare_handler_t *)&local_1118);
  if (local_1108 != (code *)0x0) {
    (*local_1108)(&local_1118,&local_1118,__destroy_functor);
  }
  if (local_1368 != (code *)0x0) {
    (*local_1368)(&local_1378,&local_1378,__destroy_functor);
  }
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"file","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1500._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f0._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:420:18)>
       ::_M_invoke;
  local_14f0._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:420:18)>
       ::_M_manager;
  local_1500._0_8_ = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)local_1500);
  if ((__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>)
      local_14f0._0_8_ !=
      (tuple<JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>)0x0) {
    (*(code *)local_14f0._0_8_)(local_1500,local_1500,3);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"creationdate","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_b90._8_8_ = 0;
  local_b78 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:336:14)>
              ::_M_invoke;
  local_b80 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:336:14)>
              ::_M_manager;
  local_b90._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_b90);
  if (local_b80 != (code *)0x0) {
    (*local_b80)(&local_b90,&local_b90,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"description","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_bb0._8_8_ = 0;
  local_b98 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:339:14)>
              ::_M_invoke;
  local_ba0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:339:14)>
              ::_M_manager;
  local_bb0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_bb0);
  if (local_ba0 != (code *)0x0) {
    (*local_ba0)(&local_bb0,&local_bb0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"filename","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_bd0._8_8_ = 0;
  local_bb8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:342:14)>
              ::_M_invoke;
  local_bc0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:342:14)>
              ::_M_manager;
  local_bd0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_bd0);
  if (local_bc0 != (code *)0x0) {
    (*local_bc0)(&local_bd0,&local_bd0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"key","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_bf0._8_8_ = 0;
  local_bd8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:345:14)>
              ::_M_invoke;
  local_be0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:345:14)>
              ::_M_manager;
  local_bf0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_bf0);
  if (local_be0 != (code *)0x0) {
    (*local_be0)(&local_bf0,&local_bf0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"mimetype","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_c10._8_8_ = 0;
  local_bf8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:348:14)>
              ::_M_invoke;
  local_c00 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:348:14)>
              ::_M_manager;
  local_c10._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_c10);
  if (local_c00 != (code *)0x0) {
    (*local_c00)(&local_c10,&local_c10,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"moddate","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_c30._8_8_ = 0;
  local_c18 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:351:14)>
              ::_M_invoke;
  local_c20 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:351:14)>
              ::_M_manager;
  local_c30._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_c30);
  if (local_c20 != (code *)0x0) {
    (*local_c20)(&local_c30,&local_c30,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"replace","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_c50._8_8_ = 0;
  local_c38 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:354:9)>
              ::_M_invoke;
  local_c40 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:354:9)>
              ::_M_manager;
  local_c50._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_c50);
  if (local_c40 != (code *)0x0) {
    (*local_c40)(&local_c50,&local_c50,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  psVar4 = psVar5 + -1;
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar4;
  p_Var3 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar4 = *ppsVar1;
  }
  psVar5 = psVar4 + -1;
  *ppJVar2 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"removeAttachment","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1398._8_8_ = 0;
  local_1398._M_unused._M_object = operator_new(0x18);
  *(code **)local_1398._M_unused._0_8_ = beginRemoveAttachmentArray;
  *(undefined8 *)((long)local_1398._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1398._M_unused._0_8_ + 0x10) = this;
  local_1380 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_1388 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1138._8_8_ = 0;
  local_1138._M_unused._M_object = operator_new(0x18);
  *(code **)local_1138._M_unused._0_8_ = endRemoveAttachmentArray;
  *(undefined8 *)((long)local_1138._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1138._M_unused._0_8_ + 0x10) = this;
  local_1120 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_1128 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1398,(bare_handler_t *)&local_1138);
  if (local_1128 != (code *)0x0) {
    (*local_1128)(&local_1138,&local_1138,__destroy_functor);
  }
  if (local_1388 != (code *)0x0) {
    (*local_1388)(&local_1398,&local_1398,__destroy_functor);
  }
  local_c70._8_8_ = 0;
  local_c58 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:360:14)>
              ::_M_invoke;
  local_c60 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:360:14)>
              ::_M_manager;
  local_c70._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_c70);
  if (local_c60 != (code *)0x0) {
    (*local_c60)(&local_c70,&local_c70,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  psVar4 = psVar5 + -1;
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar4;
  p_Var3 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar4 = *ppsVar1;
  }
  *ppJVar2 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"copyAttachmentsFrom","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_13b8._8_8_ = 0;
  local_13b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_13b8._M_unused._0_8_ = beginCopyAttachmentsFromArray;
  *(undefined8 *)((long)local_13b8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_13b8._M_unused._0_8_ + 0x10) = this;
  local_13a0 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_13a8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1158._8_8_ = 0;
  local_1158._M_unused._M_object = operator_new(0x18);
  *(code **)local_1158._M_unused._0_8_ = endCopyAttachmentsFromArray;
  *(undefined8 *)((long)local_1158._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1158._M_unused._0_8_ + 0x10) = this;
  local_1140 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_1148 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_13b8,(bare_handler_t *)&local_1158);
  if (local_1148 != (code *)0x0) {
    (*local_1148)(&local_1158,&local_1158,__destroy_functor);
  }
  if (local_13a8 != (code *)0x0) {
    (*local_13a8)(&local_13b8,&local_13b8,__destroy_functor);
  }
  local_13d8._8_8_ = 0;
  local_13d8._M_unused._M_object = operator_new(0x18);
  *(code **)local_13d8._M_unused._0_8_ = beginCopyAttachmentsFrom;
  *(undefined8 *)((long)local_13d8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_13d8._M_unused._0_8_ + 0x10) = this;
  local_13c0 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_13c8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1178._8_8_ = 0;
  local_1178._M_unused._M_object = operator_new(0x18);
  *(code **)local_1178._M_unused._0_8_ = endCopyAttachmentsFrom;
  *(undefined8 *)((long)local_1178._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1178._M_unused._0_8_ + 0x10) = this;
  local_1160 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_1168 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict((Handlers *)this->jh,(json_handler_t *)&local_13d8,(bare_handler_t *)&local_1178);
  if (local_1168 != (code *)0x0) {
    (*local_1168)(&local_1178,&local_1178,__destroy_functor);
  }
  if (local_13c8 != (code *)0x0) {
    (*local_13c8)(&local_13d8,&local_13d8,__destroy_functor);
  }
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"file","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1500._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f0._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:462:18)>
       ::_M_invoke;
  local_14f0._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:462:18)>
       ::_M_manager;
  local_1500._0_8_ = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)local_1500);
  if ((__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>)
      local_14f0._0_8_ !=
      (tuple<JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>)0x0) {
    (*(code *)local_14f0._0_8_)(local_1500,local_1500,3);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"password","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1500._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f0._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:468:18)>
       ::_M_invoke;
  local_14f0._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:468:18)>
       ::_M_manager;
  local_1500._0_8_ = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)local_1500);
  if ((__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>)
      local_14f0._0_8_ !=
      (tuple<JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>)0x0) {
    (*(code *)local_14f0._0_8_)(local_1500,local_1500,3);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"prefix","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_c90._8_8_ = 0;
  local_c78 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:373:14)>
              ::_M_invoke;
  local_c80 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:373:14)>
              ::_M_manager;
  local_c90._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_c90);
  if (local_c80 != (code *)0x0) {
    (*local_c80)(&local_c90,&local_c90,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  psVar4 = psVar5 + -1;
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar4;
  p_Var3 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar4 = *ppsVar1;
  }
  psVar5 = psVar4 + -1;
  *ppJVar2 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"collate","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_cb0._8_8_ = 0;
  local_c98 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:378:14)>
              ::_M_invoke;
  local_ca0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:378:14)>
              ::_M_manager;
  local_cb0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_cb0);
  if (local_ca0 != (code *)0x0) {
    (*local_ca0)(&local_cb0,&local_cb0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"flattenAnnotations","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_cd0._8_8_ = 0;
  local_cb8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:381:35)>
              ::_M_invoke;
  local_cc0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:381:35)>
              ::_M_manager;
  local_cd0._M_unused._M_object = this;
  addChoices(this,initHandlers::flatten_choices,true,(param_handler_t *)&local_cd0);
  if (local_cc0 != (code *)0x0) {
    (*local_cc0)(&local_cd0,&local_cd0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"flattenRotation","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_cf0._8_8_ = 0;
  local_cd8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:384:9)>
              ::_M_invoke;
  local_ce0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:384:9)>
              ::_M_manager;
  local_cf0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_cf0);
  if (local_ce0 != (code *)0x0) {
    (*local_ce0)(&local_cf0,&local_cf0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"generateAppearances","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_d10._8_8_ = 0;
  local_cf8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:387:9)>
              ::_M_invoke;
  local_d00 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:387:9)>
              ::_M_manager;
  local_d10._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_d10);
  if (local_d00 != (code *)0x0) {
    (*local_d00)(&local_d10,&local_d10,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"keepInlineImages","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_d30._8_8_ = 0;
  local_d18 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:390:9)>
              ::_M_invoke;
  local_d20 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:390:9)>
              ::_M_manager;
  local_d30._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_d30);
  if (local_d20 != (code *)0x0) {
    (*local_d20)(&local_d30,&local_d30,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"oiMinArea","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_d50._8_8_ = 0;
  local_d38 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:393:14)>
              ::_M_invoke;
  local_d40 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:393:14)>
              ::_M_manager;
  local_d50._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_d50);
  if (local_d40 != (code *)0x0) {
    (*local_d40)(&local_d50,&local_d50,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"oiMinHeight","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_d70._8_8_ = 0;
  local_d58 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:396:14)>
              ::_M_invoke;
  local_d60 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:396:14)>
              ::_M_manager;
  local_d70._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_d70);
  if (local_d60 != (code *)0x0) {
    (*local_d60)(&local_d70,&local_d70,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"oiMinWidth","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_d90._8_8_ = 0;
  local_d78 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:399:14)>
              ::_M_invoke;
  local_d80 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:399:14)>
              ::_M_manager;
  local_d90._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_d90);
  if (local_d80 != (code *)0x0) {
    (*local_d80)(&local_d90,&local_d90,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"optimizeImages","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_db0._8_8_ = 0;
  local_d98 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:402:9)>
              ::_M_invoke;
  local_da0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:402:9)>
              ::_M_manager;
  local_db0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_db0);
  if (local_da0 != (code *)0x0) {
    (*local_da0)(&local_db0,&local_db0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"pages","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_13f8._8_8_ = 0;
  local_13f8._M_unused._M_object = operator_new(0x18);
  *(code **)local_13f8._M_unused._0_8_ = beginPagesArray;
  *(undefined8 *)((long)local_13f8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_13f8._M_unused._0_8_ + 0x10) = this;
  local_13e0 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_13e8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1198._8_8_ = 0;
  local_1198._M_unused._M_object = operator_new(0x18);
  *(code **)local_1198._M_unused._0_8_ = endPagesArray;
  *(undefined8 *)((long)local_1198._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1198._M_unused._0_8_ + 0x10) = this;
  local_1180 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_1188 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_13f8,(bare_handler_t *)&local_1198);
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,__destroy_functor);
  }
  if (local_13e8 != (code *)0x0) {
    (*local_13e8)(&local_13f8,&local_13f8,__destroy_functor);
  }
  local_1418._8_8_ = 0;
  local_1418._M_unused._M_object = operator_new(0x18);
  *(code **)local_1418._M_unused._0_8_ = beginPages;
  *(undefined8 *)((long)local_1418._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1418._M_unused._0_8_ + 0x10) = this;
  local_1400 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_1408 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_11b8._8_8_ = 0;
  local_11b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_11b8._M_unused._0_8_ = endPages;
  *(undefined8 *)((long)local_11b8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_11b8._M_unused._0_8_ + 0x10) = this;
  local_11a0 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_11a8 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict((Handlers *)this->jh,(json_handler_t *)&local_1418,(bare_handler_t *)&local_11b8);
  if (local_11a8 != (code *)0x0) {
    (*local_11a8)(&local_11b8,&local_11b8,__destroy_functor);
  }
  if (local_1408 != (code *)0x0) {
    (*local_1408)(&local_1418,&local_1418,__destroy_functor);
  }
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"file","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  ignoreItem((Handlers *)*ppJVar2);
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"password","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1500._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f0._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:511:18)>
       ::_M_invoke;
  local_14f0._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:511:18)>
       ::_M_manager;
  local_1500._0_8_ = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)local_1500);
  if ((__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>)
      local_14f0._0_8_ !=
      (tuple<JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>)0x0) {
    (*(code *)local_14f0._0_8_)(local_1500,local_1500,3);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"range","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_dd0._8_8_ = 0;
  local_db8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:414:14)>
              ::_M_invoke;
  local_dc0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:414:14)>
              ::_M_manager;
  local_dd0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_dd0);
  if (local_dc0 != (code *)0x0) {
    (*local_dc0)(&local_dd0,&local_dd0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  psVar4 = psVar5 + -1;
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar4;
  p_Var3 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar4 = *ppsVar1;
  }
  psVar5 = psVar4 + -1;
  *ppJVar2 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"removeInfo","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_df0._8_8_ = 0;
  local_dd8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:419:9)>
              ::_M_invoke;
  local_de0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:419:9)>
              ::_M_manager;
  local_df0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_df0);
  if (local_de0 != (code *)0x0) {
    (*local_de0)(&local_df0,&local_df0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"removeMetadata","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_e10._8_8_ = 0;
  local_df8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:422:9)>
              ::_M_invoke;
  local_e00 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:422:9)>
              ::_M_manager;
  local_e10._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_e10);
  if (local_e00 != (code *)0x0) {
    (*local_e00)(&local_e10,&local_e10,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"removePageLabels","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_e30._8_8_ = 0;
  local_e18 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:425:9)>
              ::_M_invoke;
  local_e20 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:425:9)>
              ::_M_manager;
  local_e30._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_e30);
  if (local_e20 != (code *)0x0) {
    (*local_e20)(&local_e30,&local_e30,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"removeStructure","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_e50._8_8_ = 0;
  local_e38 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:428:9)>
              ::_M_invoke;
  local_e40 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:428:9)>
              ::_M_manager;
  local_e50._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_e50);
  if (local_e40 != (code *)0x0) {
    (*local_e40)(&local_e50,&local_e50,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"reportMemoryUsage","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_e70._8_8_ = 0;
  local_e58 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:431:9)>
              ::_M_invoke;
  local_e60 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:431:9)>
              ::_M_manager;
  local_e70._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_e70);
  if (local_e60 != (code *)0x0) {
    (*local_e60)(&local_e70,&local_e70,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"rotate","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1438._8_8_ = 0;
  local_1438._M_unused._M_object = operator_new(0x18);
  *(code **)local_1438._M_unused._0_8_ = beginRotateArray;
  *(undefined8 *)((long)local_1438._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1438._M_unused._0_8_ + 0x10) = this;
  local_1420 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_1428 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_11d8._8_8_ = 0;
  local_11d8._M_unused._M_object = operator_new(0x18);
  *(code **)local_11d8._M_unused._0_8_ = endRotateArray;
  *(undefined8 *)((long)local_11d8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_11d8._M_unused._0_8_ + 0x10) = this;
  local_11c0 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_11c8 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1438,(bare_handler_t *)&local_11d8);
  if (local_11c8 != (code *)0x0) {
    (*local_11c8)(&local_11d8,&local_11d8,__destroy_functor);
  }
  if (local_1428 != (code *)0x0) {
    (*local_1428)(&local_1438,&local_1438,__destroy_functor);
  }
  local_e90._8_8_ = 0;
  local_e78 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:435:14)>
              ::_M_invoke;
  local_e80 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:435:14)>
              ::_M_manager;
  local_e90._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_e90);
  if (local_e80 != (code *)0x0) {
    (*local_e80)(&local_e90,&local_e90,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  psVar4 = psVar5 + -1;
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar4;
  p_Var3 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar4 = *ppsVar1;
  }
  *ppJVar2 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"setPageLabels","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1458._8_8_ = 0;
  local_1458._M_unused._M_object = operator_new(0x18);
  *(code **)local_1458._M_unused._0_8_ = beginSetPageLabelsArray;
  *(undefined8 *)((long)local_1458._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1458._M_unused._0_8_ + 0x10) = this;
  local_1440 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_1448 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_11f8._8_8_ = 0;
  local_11f8._M_unused._M_object = operator_new(0x18);
  *(code **)local_11f8._M_unused._0_8_ = endSetPageLabelsArray;
  *(undefined8 *)((long)local_11f8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_11f8._M_unused._0_8_ + 0x10) = this;
  local_11e0 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_11e8 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1458,(bare_handler_t *)&local_11f8);
  if (local_11e8 != (code *)0x0) {
    (*local_11e8)(&local_11f8,&local_11f8,__destroy_functor);
  }
  if (local_1448 != (code *)0x0) {
    (*local_1448)(&local_1458,&local_1458,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->accumulated_args,
                    (this->accumulated_args).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_1500._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f0._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:608:18)>
       ::_M_invoke;
  local_14f0._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:608:18)>
       ::_M_manager;
  local_1500._0_8_ = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)local_1500);
  if ((__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>)
      local_14f0._0_8_ !=
      (tuple<JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>)0x0) {
    (*(code *)local_14f0._0_8_)(local_1500,local_1500,3);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  psVar4 = psVar5 + -1;
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar4;
  p_Var3 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar4 = *ppsVar1;
  }
  *ppJVar2 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"overlay","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1478._8_8_ = 0;
  local_1478._M_unused._M_object = operator_new(0x18);
  *(code **)local_1478._M_unused._0_8_ = beginOverlayArray;
  *(undefined8 *)((long)local_1478._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1478._M_unused._0_8_ + 0x10) = this;
  local_1460 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_1468 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1218._8_8_ = 0;
  local_1218._M_unused._M_object = operator_new(0x18);
  *(code **)local_1218._M_unused._0_8_ = endOverlayArray;
  *(undefined8 *)((long)local_1218._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1218._M_unused._0_8_ + 0x10) = this;
  local_1200 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_1208 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1478,(bare_handler_t *)&local_1218);
  if (local_1208 != (code *)0x0) {
    (*local_1208)(&local_1218,&local_1218,__destroy_functor);
  }
  if (local_1468 != (code *)0x0) {
    (*local_1468)(&local_1478,&local_1478,__destroy_functor);
  }
  local_1498._8_8_ = 0;
  local_1498._M_unused._M_object = operator_new(0x18);
  *(code **)local_1498._M_unused._0_8_ = beginOverlay;
  *(undefined8 *)((long)local_1498._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1498._M_unused._0_8_ + 0x10) = this;
  local_1480 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_1488 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1238._8_8_ = 0;
  local_1238._M_unused._M_object = operator_new(0x18);
  *(code **)local_1238._M_unused._0_8_ = endOverlay;
  *(undefined8 *)((long)local_1238._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1238._M_unused._0_8_ + 0x10) = this;
  local_1220 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_1228 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict((Handlers *)this->jh,(json_handler_t *)&local_1498,(bare_handler_t *)&local_1238);
  if (local_1228 != (code *)0x0) {
    (*local_1228)(&local_1238,&local_1238,__destroy_functor);
  }
  if (local_1488 != (code *)0x0) {
    (*local_1488)(&local_1498,&local_1498,__destroy_functor);
  }
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"file","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  ignoreItem((Handlers *)*ppJVar2);
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"password","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1500._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f0._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:550:18)>
       ::_M_invoke;
  local_14f0._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:550:18)>
       ::_M_manager;
  local_1500._0_8_ = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)local_1500);
  if ((__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>)
      local_14f0._0_8_ !=
      (tuple<JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>)0x0) {
    (*(code *)local_14f0._0_8_)(local_1500,local_1500,3);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"from","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_eb0._8_8_ = 0;
  local_e98 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:453:14)>
              ::_M_invoke;
  local_ea0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:453:14)>
              ::_M_manager;
  local_eb0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_eb0);
  if (local_ea0 != (code *)0x0) {
    (*local_ea0)(&local_eb0,&local_eb0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"repeat","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_ed0._8_8_ = 0;
  local_eb8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:456:14)>
              ::_M_invoke;
  local_ec0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:456:14)>
              ::_M_manager;
  local_ed0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_ed0);
  if (local_ec0 != (code *)0x0) {
    (*local_ec0)(&local_ed0,&local_ed0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"to","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_ef0._8_8_ = 0;
  local_ed8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:459:14)>
              ::_M_invoke;
  local_ee0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:459:14)>
              ::_M_manager;
  local_ef0._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_ef0);
  if (local_ee0 != (code *)0x0) {
    (*local_ee0)(&local_ef0,&local_ef0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  psVar4 = psVar5 + -1;
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar4;
  p_Var3 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar4 = *ppsVar1;
  }
  psVar5 = psVar4 + -1;
  *ppJVar2 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"underlay","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_14b8._8_8_ = 0;
  local_14b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_14b8._M_unused._0_8_ = beginUnderlayArray;
  *(undefined8 *)((long)local_14b8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_14b8._M_unused._0_8_ + 0x10) = this;
  local_14a0 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_14a8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1258._8_8_ = 0;
  local_1258._M_unused._M_object = operator_new(0x18);
  *(code **)local_1258._M_unused._0_8_ = endUnderlayArray;
  *(undefined8 *)((long)local_1258._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1258._M_unused._0_8_ + 0x10) = this;
  local_1240 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_1248 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_14b8,(bare_handler_t *)&local_1258);
  if (local_1248 != (code *)0x0) {
    (*local_1248)(&local_1258,&local_1258,__destroy_functor);
  }
  if (local_14a8 != (code *)0x0) {
    (*local_14a8)(&local_14b8,&local_14b8,__destroy_functor);
  }
  local_14d8._8_8_ = 0;
  local_14d8._M_unused._M_object = operator_new(0x18);
  *(code **)local_14d8._M_unused._0_8_ = beginUnderlay;
  *(undefined8 *)((long)local_14d8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_14d8._M_unused._0_8_ + 0x10) = this;
  local_14c0 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1278._8_8_ = 0;
  local_1278._M_unused._M_object = operator_new(0x18);
  *(code **)local_1278._M_unused._0_8_ = endUnderlay;
  *(undefined8 *)((long)local_1278._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1278._M_unused._0_8_ + 0x10) = this;
  local_1260 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_invoke;
  local_1268 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict((Handlers *)this->jh,(json_handler_t *)&local_14d8,(bare_handler_t *)&local_1278);
  if (local_1268 != (code *)0x0) {
    (*local_1268)(&local_1278,&local_1278,__destroy_functor);
  }
  if (local_14c8 != (code *)0x0) {
    (*local_14c8)(&local_14d8,&local_14d8,__destroy_functor);
  }
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"file","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  ignoreItem((Handlers *)*ppJVar2);
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"password","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_1500._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f0._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:589:18)>
       ::_M_invoke;
  local_14f0._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:589:18)>
       ::_M_manager;
  local_1500._0_8_ = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)local_1500);
  if ((__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>)
      local_14f0._0_8_ !=
      (tuple<JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>)0x0) {
    (*(code *)local_14f0._0_8_)(local_1500,local_1500,3);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"from","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_f10._8_8_ = 0;
  local_ef8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:473:14)>
              ::_M_invoke;
  local_f00 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:473:14)>
              ::_M_manager;
  local_f10._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_f10);
  if (local_f00 != (code *)0x0) {
    (*local_f00)(&local_f10,&local_f10,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"repeat","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_f30._8_8_ = 0;
  local_f18 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:476:14)>
              ::_M_invoke;
  local_f20 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:476:14)>
              ::_M_manager;
  local_f30._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_f30);
  if (local_f20 != (code *)0x0) {
    (*local_f20)(&local_f30,&local_f30,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"to","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_f50._8_8_ = 0;
  local_f38 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:479:14)>
              ::_M_invoke;
  local_f40 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:479:14)>
              ::_M_manager;
  local_f50._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_f50);
  if (local_f40 != (code *)0x0) {
    (*local_f40)(&local_f50,&local_f50,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  psVar4 = psVar5 + -1;
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar4;
  p_Var3 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar4 = *ppsVar1;
  }
  psVar5 = psVar4 + -1;
  *ppJVar2 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"warningExit0","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_f70._8_8_ = 0;
  local_f58 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:484:9)>
              ::_M_invoke;
  local_f60 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:484:9)>
              ::_M_manager;
  local_f70._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_f70);
  if (local_f60 != (code *)0x0) {
    (*local_f60)(&local_f70,&local_f70,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"jobJsonFile","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_f90._8_8_ = 0;
  local_f78 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:487:14)>
              ::_M_invoke;
  local_f80 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:487:14)>
              ::_M_manager;
  local_f90._M_unused._M_object = this;
  addParameter((Handlers *)this->jh,(param_handler_t *)&local_f90);
  if (local_f80 != (code *)0x0) {
    (*local_f80)(&local_f90,&local_f90,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1500,"preserveUnreferencedResources","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_fb0._8_8_ = 0;
  local_f98 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:490:9)>
              ::_M_invoke;
  local_fa0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:490:9)>
              ::_M_manager;
  local_fb0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_fb0);
  if (local_fa0 != (code *)0x0) {
    (*local_fa0)(&local_fb0,&local_fb0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"requiresPassword","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_fd0._8_8_ = 0;
  local_fb8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:493:9)>
              ::_M_invoke;
  local_fc0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:493:9)>
              ::_M_manager;
  local_fd0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_fd0);
  if (local_fc0 != (code *)0x0) {
    (*local_fc0)(&local_fd0,&local_fd0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  *ppJVar2 = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1500._0_8_ = (element_type *)local_14f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"isEncrypted","");
  pushKey(this,(string *)local_1500);
  if ((element_type *)local_1500._0_8_ != (element_type *)local_14f0) {
    operator_delete((void *)local_1500._0_8_,(ulong)(local_14f0._0_8_ + 1));
  }
  local_ff0._8_8_ = 0;
  local_fd8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:496:9)>
              ::_M_invoke;
  local_fe0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:496:9)>
              ::_M_manager;
  local_ff0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_ff0);
  if (local_fe0 != (code *)0x0) {
    (*local_fe0)(&local_ff0,&local_ff0,__destroy_functor);
  }
  psVar4 = *ppsVar1;
  psVar5 = psVar4 + -1;
  *ppsVar1 = psVar5;
  p_Var3 = psVar4[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    psVar5 = *ppsVar1;
  }
  this->jh = psVar5[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((long)psVar5 -
      (long)(this->json_handlers).
            super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x10) {
    return;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"QPDFJob_json: json_handlers size != 1 at end");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
Handlers::initHandlers()
{
    this->json_handlers.emplace_back(std::make_shared<JSONHandler>());
    this->jh = this->json_handlers.back().get();
    jh->addDictHandlers(
        [](std::string const&, JSON) {},
        [this](std::string const&) {
            if (!this->partial) {
                c_main->checkConfiguration();
            }
        });

#include <qpdf/auto_job_json_init.hh>

    // We have `bits` in the CLI but not in the JSON. Reference this variable so it doesn't generate
    // a warning.
    [](char const**) {}(enc_bits_choices);

    if (this->json_handlers.size() != 1) {
        throw std::logic_error("QPDFJob_json: json_handlers size != 1 at end");
    }
}